

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlineedit.cpp
# Opt level: O1

void QLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  InputMethodQuery property;
  long *plVar1;
  uint *puVar2;
  int *piVar3;
  long lVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  QString *placeholderText;
  QWidgetLineControl *pQVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  undefined4 uVar11;
  anon_union_24_3_e3d07ef4_for_data *paVar12;
  int iVar13;
  undefined4 in_register_00000014;
  QArrayData *pQVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QVariant in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_58._8_8_ = _a[1];
    paVar12 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar13 = 0;
    goto LAB_0042504a;
  case 1:
    local_58._8_8_ = _a[1];
    paVar12 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar13 = 1;
    goto LAB_0042504a;
  case 2:
    cursorPositionChanged((QLineEdit *)_o,*_a[1],*_a[2]);
    break;
  case 3:
    iVar13 = 3;
    goto LAB_00425048;
  case 4:
    iVar13 = 4;
    goto LAB_00425048;
  case 5:
    iVar13 = 5;
    goto LAB_00425048;
  case 6:
    iVar13 = 6;
LAB_00425048:
    paVar12 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
LAB_0042504a:
    QMetaObject::activate(_o,&staticMetaObject,iVar13,&paVar12->shared);
    break;
  case 7:
    QLineEditPrivate::setText(*(QLineEditPrivate **)(_o + 8),(QString *)_a[1]);
    break;
  case 8:
    clear((QLineEdit *)_o);
    break;
  case 9:
    pQVar7 = *(QWidgetLineControl **)(*(long *)(_o + 8) + 600);
    *(undefined4 *)(pQVar7 + 0x40) = 0;
    *(undefined8 *)(pQVar7 + 0x110) = 0;
    QWidgetLineControl::moveCursor(pQVar7,*(int *)(pQVar7 + 0x28),true);
    break;
  case 10:
    undo((QLineEdit *)_o);
    break;
  case 0xb:
    redo((QLineEdit *)_o);
    break;
  case 0xc:
    cut((QLineEdit *)_o);
    break;
  case 0xd:
    QWidgetLineControl::copy
              (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),(EVP_PKEY_CTX *)0x0,
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
    break;
  case 0xe:
    QWidgetLineControl::paste(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),Clipboard);
    break;
  case 0xf:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    property = *_a[1];
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
    inputMethodQuery((QVariant *)&local_58,(QLineEdit *)_o,property,in_stack_ffffffffffffff88);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_00424e86_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == textChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == textEdited) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == cursorPositionChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == returnPressed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == editingFinished) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == selectionChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_00424e86_caseD_3;
      }
      if (((code *)*plVar1 == inputRejected) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_00424e86_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_00424e86_caseD_3;
        goto switchD_00424e86_caseD_1;
      }
    }
    goto switchD_00424e86_caseD_2;
  }
switchD_00424e86_caseD_1:
  if (0x12 < (uint)_id) goto LAB_004253fb;
  puVar2 = (uint *)*_a;
  switch(_id) {
  case 0:
    QWidgetLineControl::inputMask
              ((QString *)&local_58,*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
    goto LAB_0042538b;
  case 1:
    QWidgetLineControl::text((QString *)&local_58,*(QWidgetLineControl **)(*(long *)(_o + 8) + 600))
    ;
    goto LAB_0042538b;
  case 2:
    uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x60);
    break;
  case 3:
    bVar8 = *(byte *)(*(long *)(_o + 8) + 0x27c);
    goto LAB_004252b9;
  case 4:
    uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 4 & 3;
    break;
  case 5:
    QTextLayout::text();
    goto LAB_0042538b;
  case 6:
    uVar9 = *(uint *)(*(long *)(*(long *)(_o + 8) + 600) + 0x40);
    break;
  case 7:
    uVar9 = *(uint *)(*(long *)(_o + 8) + 0x288);
    break;
  case 8:
    bVar15 = *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) ==
             *(int *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
    goto LAB_004253f6;
  case 9:
    lVar10 = *(long *)(*(long *)(_o + 8) + 600);
    bVar15 = *(int *)(lVar10 + 0x110) < *(int *)(lVar10 + 0x114) && *(long *)(lVar10 + 0x28) != 0;
    goto LAB_0042532c;
  case 10:
    selectedText((QString *)&local_58,(QLineEdit *)_o);
LAB_0042538b:
    pQVar14 = *(QArrayData **)puVar2;
    *(PrivateShared **)puVar2 = local_58.shared;
    puVar5 = *(undefined1 **)(puVar2 + 2);
    *(undefined8 *)(puVar2 + 2) = local_58._8_8_;
    puVar6 = *(undefined1 **)(puVar2 + 4);
    *(undefined8 *)(puVar2 + 4) = local_58._16_8_;
    local_58.shared = (PrivateShared *)pQVar14;
    local_58._8_8_ = puVar5;
    local_58._16_8_ = puVar6;
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
LAB_004253ce:
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
    goto LAB_004253fb;
  case 0xb:
    bVar8 = *(byte *)(*(long *)(_o + 8) + 0x27c) >> 3;
    goto LAB_004252b9;
  case 0xc:
    bVar8 = *(byte *)(*(long *)(*(long *)(_o + 8) + 600) + 0x50) >> 2;
LAB_004252b9:
    bVar15 = (bool)(bVar8 & 1);
    goto LAB_0042532c;
  case 0xd:
    bVar15 = QWidgetLineControl::isUndoAvailable(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
    goto LAB_0042532c;
  case 0xe:
    bVar15 = QWidgetLineControl::isRedoAvailable(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600));
    goto LAB_0042532c;
  case 0xf:
    bVar15 = QWidgetLineControl::hasAcceptableInput
                       (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),
                        (QString *)(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600) + 0x18));
LAB_0042532c:
    *(bool *)puVar2 = bVar15;
    goto LAB_004253fb;
  case 0x10:
    lVar10 = *(long *)(_o + 8);
    piVar3 = *(int **)(lVar10 + 0x2a8);
    lVar4 = *(long *)(lVar10 + 0x2b0);
    lVar10 = *(long *)(lVar10 + 0x2b8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    pQVar14 = *(QArrayData **)puVar2;
    *(int **)puVar2 = piVar3;
    *(long *)(puVar2 + 2) = lVar4;
    *(long *)(puVar2 + 4) = lVar10;
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_004253fb;
      goto LAB_004253ce;
    }
    goto LAB_004253fb;
  case 0x11:
    uVar9 = QTextLayout::cursorMoveStyle();
    break;
  case 0x12:
    lVar10 = qt_qFindChild_helper
                       (_o,"_q_qlineeditclearaction",0x4000000000000017,&QAction::staticMetaObject,1
                       );
    bVar15 = lVar10 == 0;
LAB_004253f6:
    *(bool *)puVar2 = !bVar15;
    goto LAB_004253fb;
  }
  *puVar2 = uVar9;
LAB_004253fb:
  if (_c == WriteProperty) {
switchD_00424e86_caseD_2:
    if ((uint)_id < 0x13) {
      placeholderText = (QString *)*_a;
      switch(_id) {
      case 0:
        QWidgetLineControl::setInputMask
                  (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),placeholderText);
        break;
      case 1:
        QLineEditPrivate::setText(*(QLineEditPrivate **)(_o + 8),placeholderText);
        break;
      case 2:
        pQVar7 = *(QWidgetLineControl **)(*(long *)(_o + 8) + 600);
        if (*(long *)(pQVar7 + 0xe8) == 0) {
          *(undefined4 *)(pQVar7 + 0x60) = *(undefined4 *)&(placeholderText->d).d;
          QWidgetLineControl::setText(pQVar7,(QString *)(pQVar7 + 0x18));
        }
        break;
      case 3:
        *(byte *)(*(long *)(_o + 8) + 0x27c) =
             *(byte *)(*(long *)(_o + 8) + 0x27c) & 0xfe | *(byte *)&(placeholderText->d).d;
        QWidget::update((QWidget *)_o);
        QWidget::updateGeometry((QWidget *)_o);
        break;
      case 4:
        setEchoMode((QLineEdit *)_o,*(EchoMode *)&(placeholderText->d).d);
        break;
      case 6:
        iVar13 = *(int *)&(placeholderText->d).d;
        if ((long)iVar13 <= *(long *)(*(QWidgetLineControl **)(*(long *)(_o + 8) + 600) + 0x28)) {
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          QWidgetLineControl::moveCursor
                    (*(QWidgetLineControl **)(*(long *)(_o + 8) + 600),iVar13,false);
        }
        break;
      case 7:
        *(undefined4 *)(*(long *)(_o + 8) + 0x288) = *(undefined4 *)&(placeholderText->d).d;
        QWidget::update((QWidget *)_o);
        break;
      case 8:
        uVar11 = 0xffffffff;
        if (*(char *)&(placeholderText->d).d == '\0') {
          uVar11 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf4);
        }
        *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 600) + 0xf0) = uVar11;
        break;
      case 0xb:
        *(byte *)(*(long *)(_o + 8) + 0x27c) =
             *(byte *)(*(long *)(_o + 8) + 0x27c) & 0xf7 | *(char *)&(placeholderText->d).d << 3;
        break;
      case 0xc:
        setReadOnly((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
        break;
      case 0x10:
        setPlaceholderText((QLineEdit *)_o,placeholderText);
        break;
      case 0x11:
        QTextLayout::setCursorMoveStyle((int)*(undefined8 *)(*(long *)(_o + 8) + 600) + 0x118);
        break;
      case 0x12:
        setClearButtonEnabled((QLineEdit *)_o,*(bool *)&(placeholderText->d).d);
      }
    }
  }
switchD_00424e86_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLineEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textEdited((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->returnPressed(); break;
        case 4: _t->editingFinished(); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->inputRejected(); break;
        case 7: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->clear(); break;
        case 9: _t->selectAll(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->cut(); break;
        case 13: _t->copy(); break;
        case 14: _t->paste(); break;
        case 15: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(const QString & )>(_a, &QLineEdit::textEdited, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)(int , int )>(_a, &QLineEdit::cursorPositionChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::returnPressed, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::editingFinished, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLineEdit::*)()>(_a, &QLineEdit::inputRejected, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->inputMask(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->maxLength(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 4: *reinterpret_cast<EchoMode*>(_v) = _t->echoMode(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->displayText(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->cursorPosition(); break;
        case 7: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->isUndoAvailable(); break;
        case 14: *reinterpret_cast<bool*>(_v) = _t->isRedoAvailable(); break;
        case 15: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 17: *reinterpret_cast<Qt::CursorMoveStyle*>(_v) = _t->cursorMoveStyle(); break;
        case 18: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInputMask(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 2: _t->setMaxLength(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setEchoMode(*reinterpret_cast<EchoMode*>(_v)); break;
        case 6: _t->setCursorPosition(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 8: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 17: _t->setCursorMoveStyle(*reinterpret_cast<Qt::CursorMoveStyle*>(_v)); break;
        case 18: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}